

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O2

bool __thiscall QDtls::resumeHandshake(QDtls *this,QUdpSocket *socket)

{
  long *plVar1;
  long lVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 != (long *)0x0) {
    if (socket == (QUdpSocket *)0x0) {
      lVar2 = *(long *)(*plVar1 + -0x60);
      tr((QString *)&local_40,"Invalid (nullptr) socket",(char *)0x0,-1);
      lVar5 = *(long *)((long)plVar1 + lVar2);
      uStack_50 = 1;
    }
    else {
      iVar4 = (**(code **)(*plVar1 + 0x90))(plVar1);
      if (iVar4 == 2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          uVar3 = (**(code **)(*plVar1 + 0xb8))(plVar1,socket);
          return (bool)uVar3;
        }
        goto LAB_0023a1b8;
      }
      lVar2 = *(long *)(*plVar1 + -0x60);
      tr((QString *)&local_40,"Cannot resume, not in VerificationError state",(char *)0x0,-1);
      lVar5 = *(long *)((long)plVar1 + lVar2);
      uStack_50 = 2;
    }
    (**(code **)(lVar5 + 0x10))((long)plVar1 + lVar2,uStack_50,&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return false;
  }
LAB_0023a1b8:
  __stack_chk_fail();
}

Assistant:

bool QDtls::resumeHandshake(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters, tr("Invalid (nullptr) socket"));
        return false;
    }

    if (backend->state() != PeerVerificationFailed) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("Cannot resume, not in VerificationError state"));
        return false;
    }

    return backend->resumeHandshake(socket);
}